

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

ostream * Catch::clara::TextFlow::operator<<(ostream *os,Columns *cols)

{
  bool bVar1;
  bool bVar2;
  undefined1 local_a8 [8];
  string line;
  undefined1 local_78 [8];
  iterator __end3;
  iterator __begin3;
  Columns *__range3;
  bool first;
  Columns *cols_local;
  ostream *os_local;
  
  bVar1 = true;
  Columns::begin((iterator *)&__end3.m_activeIterators,cols);
  Columns::end((iterator *)local_78,cols);
  while( true ) {
    bVar2 = Columns::iterator::operator!=
                      ((iterator *)&__end3.m_activeIterators,(iterator *)local_78);
    if (!bVar2) break;
    Columns::iterator::operator*[abi_cxx11_
              ((string *)local_a8,(iterator *)&__end3.m_activeIterators);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      ::std::operator<<((ostream *)os,"\n");
    }
    ::std::operator<<((ostream *)os,(string *)local_a8);
    ::std::__cxx11::string::~string((string *)local_a8);
    Columns::iterator::operator++((iterator *)&__end3.m_activeIterators);
  }
  Columns::iterator::~iterator((iterator *)local_78);
  Columns::iterator::~iterator((iterator *)&__end3.m_activeIterators);
  return os;
}

Assistant:

inline friend std::ostream& operator << (std::ostream& os, Columns const& cols) {

		bool first = true;
		for (auto line : cols) {
			if (first)
				first = false;
			else
				os << "\n";
			os << line;
		}
		return os;
	}